

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::drawArraysInstanced
          (ReferenceContext *this,deUint32 mode,int first,int count,int instanceCount)

{
  bool bVar1;
  deBool dVar2;
  PrimitiveList local_48;
  PrimitiveType local_24;
  int local_20;
  PrimitiveType primitiveType;
  int instanceCount_local;
  int count_local;
  int first_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  local_20 = instanceCount;
  primitiveType = count;
  instanceCount_local = first;
  count_local = mode;
  _first_local = this;
  while (((-1 < instanceCount_local && (-1 < (int)primitiveType)) && (-1 < local_20))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      bVar1 = predrawErrorChecks(this,count_local);
      if (bVar1) {
        local_24 = rr_util::mapGLPrimitiveType(count_local);
        rr::PrimitiveList::PrimitiveList(&local_48,local_24,primitiveType,instanceCount_local);
        drawWithReference(this,&local_48,local_20);
      }
      return;
    }
  }
  setError(this,0x501);
  return;
}

Assistant:

void ReferenceContext::drawArraysInstanced (deUint32 mode, int first, int count, int instanceCount)
{
	// Error conditions
	{
		RC_IF_ERROR(first < 0 || count < 0 || instanceCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

		if (!predrawErrorChecks(mode))
			return;
	}

	// All is ok
	{
		const rr::PrimitiveType primitiveType = sglr::rr_util::mapGLPrimitiveType(mode);

		drawWithReference(rr::PrimitiveList(primitiveType, count, first), instanceCount);
	}
}